

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTools.cxx
# Opt level: O2

void cmsys::SystemTools::GetPath
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *path,char *env)

{
  pointer pbVar1;
  pointer pbVar2;
  bool bVar3;
  long lVar4;
  char *key;
  string *path_00;
  string pathEnv;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  pbVar1 = (path->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  pbVar2 = (path->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  key = "PATH";
  if (env != (char *)0x0) {
    key = env;
  }
  pathEnv._M_dataplus._M_p = (pointer)&pathEnv.field_2;
  pathEnv._M_string_length = 0;
  pathEnv.field_2._M_local_buf[0] = '\0';
  bVar3 = GetEnv(key,&pathEnv);
  if (bVar3) {
    if ((pathEnv._M_string_length != 0) &&
       (pathEnv._M_dataplus._M_p[pathEnv._M_string_length - 1] != ':')) {
      std::__cxx11::string::push_back((char)&pathEnv);
    }
    bVar3 = false;
    while (!bVar3) {
      lVar4 = std::__cxx11::string::find((char)&pathEnv,0x3a);
      bVar3 = lVar4 == -1;
      if (!bVar3) {
        std::__cxx11::string::substr((ulong)&local_50,(ulong)&pathEnv);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)path,
                   &local_50);
        std::__cxx11::string::~string((string *)&local_50);
      }
    }
    for (path_00 = (string *)
                   ((long)pbVar1 +
                   ((long)(path->
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          )._M_impl.super__Vector_impl_data._M_start - (long)pbVar2));
        path_00 !=
        (path->
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )._M_impl.super__Vector_impl_data._M_finish; path_00 = path_00 + 1) {
      ConvertToUnixSlashes(path_00);
    }
  }
  std::__cxx11::string::~string((string *)&pathEnv);
  return;
}

Assistant:

void SystemTools::GetPath(std::vector<std::string>& path, const char* env)
{
  size_t const old_size = path.size();
#if defined(_WIN32) && !defined(__CYGWIN__)
  const char pathSep = ';';
#else
  const char pathSep = ':';
#endif
  if (!env) {
    env = "PATH";
  }
  std::string pathEnv;
  if (!SystemTools::GetEnv(env, pathEnv)) {
    return;
  }

  // A hack to make the below algorithm work.
  if (!pathEnv.empty() && pathEnv.back() != pathSep) {
    pathEnv += pathSep;
  }
  std::string::size_type start = 0;
  bool done = false;
  while (!done) {
    std::string::size_type endpos = pathEnv.find(pathSep, start);
    if (endpos != std::string::npos) {
      path.push_back(pathEnv.substr(start, endpos - start));
      start = endpos + 1;
    } else {
      done = true;
    }
  }
  for (std::vector<std::string>::iterator i = path.begin() + old_size;
       i != path.end(); ++i) {
    SystemTools::ConvertToUnixSlashes(*i);
  }
}